

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O3

Result __thiscall
tonk::Connection::tonk_send(Connection *this,uint channel,uint8_t *data,uint64_t bytes64)

{
  ostringstream *this_00;
  undefined8 uVar1;
  OutputWorker *this_01;
  _func_int **pp_Var2;
  int iVar3;
  uint reason;
  undefined4 in_register_00000034;
  long lVar4;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [16];
  ErrorResult local_198 [2];
  ios_base local_128 [264];
  
  lVar4 = CONCAT44(in_register_00000034,channel);
  (this->super_IConnection)._vptr_IConnection = (_func_int **)0x0;
  iVar3 = (int)data;
  if (iVar3 == 0xff) {
    SessionOutgoing::QueueUnreliable
              ((SessionOutgoing *)local_1a8,channel + 0x168,(uint8_t *)0x3,bytes64);
  }
  else if (iVar3 - 0x32U < 6) {
    SessionOutgoing::QueueReliable
              ((SessionOutgoing *)local_1a8,channel + 0x168,(uint8_t *)(ulong)(iVar3 - 0x2c),bytes64
              );
  }
  else if (iVar3 - 0x96U < 6) {
    SessionOutgoing::QueueReliable
              ((SessionOutgoing *)local_1a8,channel + 0x168,(uint8_t *)(ulong)(iVar3 - 0x84),bytes64
              );
  }
  else {
    if (iVar3 != 200) {
      local_1a8._0_8_ = (ErrorResult *)(local_1a8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Invalid channel input parameter. See documentation","");
      pp_Var2 = (_func_int **)operator_new(0x38);
      *pp_Var2 = (_func_int *)"Connection::tonk_send";
      pp_Var2[1] = (_func_int *)(pp_Var2 + 3);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(pp_Var2 + 1),local_1a8._0_8_,
                 (undefined1 *)
                 ((long)(char **)local_1a8._0_8_ + CONCAT44(local_1a8._12_4_,local_1a8._8_4_)));
      *(undefined4 *)(pp_Var2 + 5) = 0;
      pp_Var2[6] = (_func_int *)0x4;
      (this->super_IConnection)._vptr_IConnection = pp_Var2;
      local_1c8._0_8_ = (ErrorResult *)0x0;
      Result::~Result((Result *)local_1c8);
      if ((ErrorResult *)local_1a8._0_8_ != (ErrorResult *)(local_1a8 + 0x10)) {
        operator_delete((void *)local_1a8._0_8_);
      }
      goto LAB_0013c3f1;
    }
    SessionOutgoing::QueueUnordered((SessionOutgoing *)local_1a8,(uint8_t *)(lVar4 + 0x168),bytes64)
    ;
  }
  uVar1 = local_1a8._0_8_;
  local_1a8._0_8_ = (ErrorResult *)0x0;
  (this->super_IConnection)._vptr_IConnection = (_func_int **)uVar1;
  Result::~Result((Result *)local_1a8);
LAB_0013c3f1:
  if ((this->super_IConnection)._vptr_IConnection != (_func_int **)0x0) {
    Result::ToJson_abi_cxx11_((string *)local_1c8,(Result *)this);
    if (*(int *)(lVar4 + 0x118) < 5) {
      local_1a8._0_8_ = *(undefined8 *)(lVar4 + 0x110);
      this_00 = (ostringstream *)(local_1a8 + 0x10);
      local_1a8._8_4_ = 4;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,*(char **)(lVar4 + 0x148),*(long *)(lVar4 + 0x150));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"tonk_send failed: ",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,(char *)local_1c8._0_8_,local_1c8._8_8_);
      this_01 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1a8);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_128);
    }
    if ((ErrorResult *)local_1c8._0_8_ != (ErrorResult *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_);
    }
    pp_Var2 = (this->super_IConnection)._vptr_IConnection;
    if (pp_Var2 == (_func_int **)0x0) {
      reason = 0;
    }
    else {
      reason = *(uint *)(pp_Var2 + 6);
    }
    RefCounter::StartShutdown((RefCounter *)(lVar4 + 8),reason,(Result *)this);
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result Connection::tonk_send(unsigned channel, const uint8_t* data, uint64_t bytes64)
{
    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    TONK_DEBUG_ASSERT(SelfRefCount.DoesAppHoldReference());

    const size_t bytes = static_cast<size_t>(bytes64);
    Result result;

    if (channel == TonkChannel_Unreliable) {
        result = Outgoing.QueueUnreliable(protocol::MessageType_Unreliable, data, bytes);
    }
    else if (channel >= TonkChannel_Reliable0 && channel <= TonkChannel_Reliable0 + TonkChannel_Last) {
        const unsigned messageType = protocol::MessageType_Reliable + channel - TonkChannel_Reliable0;

        result = Outgoing.QueueReliable(messageType, data, bytes);
    }
    else if (channel >= TonkChannel_LowPri0 && channel <= TonkChannel_LowPri0 + TonkChannel_Last) {
        const unsigned messageType = protocol::MessageType_LowPri + channel - TonkChannel_LowPri0;

        result = Outgoing.QueueReliable(messageType, data, bytes);
    }
    else if (channel == TonkChannel_Unordered) {
        result = Outgoing.QueueUnordered(data, bytes);
    }
    else {
        result = Result("Connection::tonk_send", "Invalid channel input parameter. See documentation", ErrorType::Tonk, Tonk_InvalidChannel);
    }

    if (result.IsFail())
    {
        Logger.Error("tonk_send failed: ", result.ToJson());
        SelfRefCount.StartShutdown((unsigned)result.GetErrorCode(), result);
    }

    return result;
}